

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::DictionaryFeatureType::clear_KeyType(DictionaryFeatureType *this)

{
  KeyTypeCase KVar1;
  DictionaryFeatureType *this_local;
  
  KVar1 = KeyType_case(this);
  if (KVar1 != KEYTYPE_NOT_SET) {
    if (KVar1 == kInt64KeyType) {
      if ((this->KeyType_).int64keytype_ != (Int64FeatureType *)0x0) {
        (*(((this->KeyType_).int64keytype_)->super_MessageLite)._vptr_MessageLite[1])();
      }
    }
    else if ((KVar1 == kStringKeyType) &&
            ((this->KeyType_).int64keytype_ != (Int64FeatureType *)0x0)) {
      (*(((this->KeyType_).int64keytype_)->super_MessageLite)._vptr_MessageLite[1])();
    }
  }
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void DictionaryFeatureType::clear_KeyType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.DictionaryFeatureType)
  switch (KeyType_case()) {
    case kInt64KeyType: {
      delete KeyType_.int64keytype_;
      break;
    }
    case kStringKeyType: {
      delete KeyType_.stringkeytype_;
      break;
    }
    case KEYTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = KEYTYPE_NOT_SET;
}